

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

void __thiscall LinkedObjectFile::find_functions(LinkedObjectFile *this)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  vector<Function,_std::allocator<Function>_> *in_RDI;
  value_type *word;
  bool found_function_tag_loc;
  int function_tag_loc;
  int function_end;
  int seg;
  iterator in_stack_ffffffffffffffd0;
  iterator in_stack_ffffffffffffffd8;
  __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
  in_stack_ffffffffffffffe0;
  value_type local_14;
  value_type local_10;
  int local_c;
  
  if (*(int *)&in_RDI[3].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
    if (*pvVar3 != 0) {
      __assert_fail("offset_of_data_zone_by_seg.at(0) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x171,"void LinkedObjectFile::find_functions()");
    }
  }
  else {
    for (local_c = 0;
        local_c < *(int *)&in_RDI[3].super__Vector_base<Function,_std::allocator<Function>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage; local_c = local_c + 1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
      local_10 = *pvVar3;
      while (0 < (int)local_10) {
        local_14 = local_10;
        bVar1 = false;
        do {
          local_10 = local_14 - 1;
          if ((int)local_14 < 1) goto LAB_001ab401;
          std::
          vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                *)in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
          in_stack_ffffffffffffffe0._M_current =
               (Function *)
               std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                         (in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
          local_14 = local_10;
        } while (((in_stack_ffffffffffffffe0._M_current)->segment != TYPE_PTR) ||
                (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_ffffffffffffffd0._M_current,(char *)in_RDI),
                !bVar2));
        bVar1 = true;
LAB_001ab401:
        if (!bVar1) {
          __assert_fail("found_function_tag_loc",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x187,"void LinkedObjectFile::find_functions()");
        }
        *(int *)&in_RDI[3].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
                 super__Vector_impl_data._M_start =
             *(int *)&in_RDI[3].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
        std::
        vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
        ::at((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
              *)in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
        std::vector<Function,std::allocator<Function>>::emplace_back<int&,int&>
                  ((vector<Function,_std::allocator<Function>_> *)
                   in_stack_ffffffffffffffe0._M_current,
                   &(in_stack_ffffffffffffffd8._M_current)->segment,
                   &(in_stack_ffffffffffffffd0._M_current)->segment);
      }
      std::
      vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
      ::at((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
            *)in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
      in_stack_ffffffffffffffd8 = std::vector<Function,_std::allocator<Function>_>::begin(in_RDI);
      std::
      vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
      ::at((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
            *)in_stack_ffffffffffffffd0._M_current,(size_type)in_RDI);
      in_stack_ffffffffffffffd0 = std::vector<Function,_std::allocator<Function>_>::end(in_RDI);
      std::
      reverse<__gnu_cxx::__normal_iterator<Function*,std::vector<Function,std::allocator<Function>>>>
                (in_stack_ffffffffffffffe0,
                 (__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>)
                 in_stack_ffffffffffffffd8._M_current);
    }
  }
  return;
}

Assistant:

void LinkedObjectFile::find_functions() {
  if (segments == 1) {
    // it's a v2 file, shouldn't have any functions
    assert(offset_of_data_zone_by_seg.at(0) == 0);
  } else {
    // we assume functions don't have any data in between them, so we use the "function" type tag to
    // mark the end of the previous function and the start of the next.  This means that some
    // functions will have a few 0x0 words after then for padding (GOAL functions are aligned), but
    // this is something that the disassembler should handle.
    for (int seg = 0; seg < segments; seg++) {
      // start at the end and work backward...
      int function_end = offset_of_data_zone_by_seg.at(seg);
      while (function_end > 0) {
        // back up until we find function type tag
        int function_tag_loc = function_end;
        bool found_function_tag_loc = false;
        for (; function_tag_loc-- > 0;) {
          auto& word = words_by_seg.at(seg).at(function_tag_loc);
          if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
            found_function_tag_loc = true;
            break;
          }
        }

        // mark this as a function, and try again from the current function start
        assert(found_function_tag_loc);
        stats.function_count++;
        functions_by_seg.at(seg).emplace_back(function_tag_loc, function_end);
        function_end = function_tag_loc;
      }

      std::reverse(functions_by_seg.at(seg).begin(), functions_by_seg.at(seg).end());
    }
  }
}